

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    State *state,uchar *in,size_t insize)

{
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  const_iterator in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  uchar *in_R8;
  uchar *in_R9;
  size_t buffersize;
  uint error;
  uchar *buffer;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffa0;
  LodePNGColorMode *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long lVar2;
  
  lVar2 = 0;
  uVar1 = lodepng_decode((uchar **)0x0,
                         (uint *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8,
                         (LodePNGState *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (uchar *)in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  if ((lVar2 != 0) && (uVar1 == 0)) {
    lodepng_get_raw_size
              (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_RDI);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (in_stack_ffffffffffffffa0,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_RDI);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              (in_RCX,in_RDX,in_R8,in_R9);
  }
  lodepng_free((void *)0x121f78);
  return uVar1;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h,
		State& state,
		const unsigned char* in, size_t insize)
	{
		unsigned char* buffer = NULL;
		unsigned error = lodepng_decode(&buffer, &w, &h, &state, in, insize);
		if (buffer && !error)
		{
			size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
			out.insert(out.end(), &buffer[0], &buffer[buffersize]);
		}
		lodepng_free(buffer);
		return error;
	}